

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O0

char * MULTILABEL::bufcache_label(labels *ld,char *c)

{
  size_t sVar1;
  uint *puVar2;
  size_t *in_RSI;
  v_array<unsigned_int> *in_RDI;
  uint i;
  uint local_14;
  size_t *local_10;
  
  sVar1 = v_array<unsigned_int>::size(in_RDI);
  *in_RSI = sVar1;
  local_10 = in_RSI + 1;
  local_14 = 0;
  while( true ) {
    sVar1 = v_array<unsigned_int>::size(in_RDI);
    if (sVar1 <= local_14) break;
    puVar2 = v_array<unsigned_int>::operator[](in_RDI,(ulong)local_14);
    *(uint *)local_10 = *puVar2;
    local_10 = (size_t *)((long)local_10 + 4);
    local_14 = local_14 + 1;
  }
  return (char *)local_10;
}

Assistant:

char* bufcache_label(labels* ld, char* c)
{
  *(size_t*)c = ld->label_v.size();
  c += sizeof(size_t);
  for (unsigned int i = 0; i < ld->label_v.size(); i++)
  {
    *(uint32_t*)c = ld->label_v[i];
    c += sizeof(uint32_t);
  }
  return c;
}